

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int nodeWrite(Rtree *pRtree,RtreeNode *pNode)

{
  sqlite3_stmt *pStmt;
  ulong uVar1;
  int iVar2;
  
  if (pNode->isDirty != 0) {
    pStmt = pRtree->pWriteNode;
    if (pNode->iNode == 0) {
      sqlite3_bind_null(pStmt,1);
    }
    else {
      sqlite3_bind_int64(pStmt,1,pNode->iNode);
    }
    sqlite3_bind_blob(pStmt,2,pNode->zData,pRtree->iNodeSize,(_func_void_void_ptr *)0x0);
    sqlite3_step(pStmt);
    pNode->isDirty = 0;
    iVar2 = sqlite3_reset(pStmt);
    sqlite3_bind_null(pStmt,2);
    if (iVar2 != 0 || pNode->iNode != 0) {
      return iVar2;
    }
    uVar1 = pRtree->db->lastRowid;
    pNode->iNode = uVar1;
    uVar1 = (uVar1 & 0xffffffff) % 0x61;
    pNode->pNext = pRtree->aHash[uVar1];
    pRtree->aHash[uVar1] = pNode;
  }
  return 0;
}

Assistant:

static int nodeWrite(Rtree *pRtree, RtreeNode *pNode){
  int rc = SQLITE_OK;
  if( pNode->isDirty ){
    sqlite3_stmt *p = pRtree->pWriteNode;
    if( pNode->iNode ){
      sqlite3_bind_int64(p, 1, pNode->iNode);
    }else{
      sqlite3_bind_null(p, 1);
    }
    sqlite3_bind_blob(p, 2, pNode->zData, pRtree->iNodeSize, SQLITE_STATIC);
    sqlite3_step(p);
    pNode->isDirty = 0;
    rc = sqlite3_reset(p);
    sqlite3_bind_null(p, 2);
    if( pNode->iNode==0 && rc==SQLITE_OK ){
      pNode->iNode = sqlite3_last_insert_rowid(pRtree->db);
      nodeHashInsert(pRtree, pNode);
    }
  }
  return rc;
}